

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  long lVar2;
  
  if ((p->flags & 0x20) == 0 && p->op == 0xa8) {
    BVar1 = 1;
    if (pMaskSet->ix[0] != p->iTable) {
      if ((long)pMaskSet->n < 2) {
        return 0;
      }
      lVar2 = 1;
      BVar1 = 0;
      do {
        if (pMaskSet->ix[lVar2] == p->iTable) {
          return 1L << ((byte)lVar2 & 0x3f);
        }
        lVar2 = lVar2 + 1;
      } while (pMaskSet->n != lVar2);
    }
    return BVar1;
  }
  if ((p->flags & 0x810000) != 0) {
    return 0;
  }
  BVar1 = sqlite3WhereExprUsageFull(pMaskSet,p);
  return BVar1;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  return sqlite3WhereExprUsageFull(pMaskSet, p);
}